

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O1

uint32 __thiscall
Js::ByteCodeBufferBuilder::AddSlotArrayDebuggerScopes
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,FunctionBody *function,
          uint debuggerScopeSlotArraySize)

{
  DebuggerScope *this_00;
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  uint32 uVar4;
  uint32 uVar5;
  undefined4 *puVar6;
  ScopeObjectChain *pSVar7;
  Type *pTVar8;
  uint index;
  uint propertiesCount;
  uint uVar9;
  uint32 uVar10;
  
  if (function == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x6fa,"(function)","function");
    if (!bVar2) goto LAB_0088f1fc;
    *puVar6 = 0;
  }
  pSVar7 = FunctionBody::GetScopeObjectChain(function);
  uVar10 = 0;
  if ((debuggerScopeSlotArraySize != 0) && (uVar10 = 0, pSVar7 != (ScopeObjectChain *)0x0)) {
    pSVar7 = FunctionBody::GetScopeObjectChain(function);
    if ((((pSVar7->pScopeChain).ptr)->
        super_ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>).count == 0) {
      uVar9 = 0;
      uVar10 = 0;
    }
    else {
      uVar10 = 0;
      index = 0;
      uVar9 = 0;
      do {
        pSVar7 = FunctionBody::GetScopeObjectChain(function);
        pTVar8 = JsUtil::
                 List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ::Item((pSVar7->pScopeChain).ptr,index);
        this_00 = pTVar8->ptr;
        bVar2 = DebuggerScope::IsSlotScope(this_00);
        if (bVar2) {
          propertiesCount = 0;
          uVar3 = PrependInt32(this,builder,L"SlotArrayDebuggerScope",index,
                               (BufferBuilderInt32 **)0x0);
          bVar2 = DebuggerScope::HasProperties(this_00);
          if (bVar2) {
            propertiesCount =
                 (((this_00->scopeProperties).ptr)->
                 super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>).
                 count;
          }
          uVar4 = PrependInt32(this,builder,L"Debugger Scope Slot Array Property Count",
                               propertiesCount,(BufferBuilderInt32 **)0x0);
          uVar5 = AddSlotArrayDebuggerScopeProperties(this,builder,this_00,propertiesCount);
          uVar10 = uVar5 + uVar4 + uVar3 + uVar10;
          uVar9 = uVar9 + 1;
        }
        index = index + 1;
        pSVar7 = FunctionBody::GetScopeObjectChain(function);
      } while (index < (uint)(((pSVar7->pScopeChain).ptr)->
                             super_ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>
                             ).count);
    }
    if (uVar9 != debuggerScopeSlotArraySize) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                  ,0x716,"(debuggerScopeSlotArraySize == slotArrayCount)",
                                  "debuggerScopeSlotArraySize == slotArrayCount");
      if (!bVar2) {
LAB_0088f1fc:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
  }
  return uVar10;
}

Assistant:

uint32 AddSlotArrayDebuggerScopes(BufferBuilderList & builder, FunctionBody* function, uint debuggerScopeSlotArraySize)
    {
        Assert(function);
        if (function->GetScopeObjectChain() == nullptr || debuggerScopeSlotArraySize == 0)
        {
            return 0u;
        }

        uint32 size = 0u;

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        size += PrependInt32(builder, _u("Start SlotArrayDebuggerScopes"), magicStartOfDebuggerScopes);
#endif // BYTE_CODE_MAGIC_CONSTANTS

        uint slotArrayCount = 0;
        for (uint i = 0u; i < static_cast<uint>(function->GetScopeObjectChain()->pScopeChain->Count()); ++i)
        {
            DebuggerScope* debuggerScope = function->GetScopeObjectChain()->pScopeChain->Item(i);
            if (debuggerScope->IsSlotScope())
            {
                // Only add slot scope debugger scopes (store the index of the scope).
                size += PrependInt32(builder, _u("SlotArrayDebuggerScope"), i);

                // Store the count of properties for the scope.
                int propertiesCount = debuggerScope->HasProperties() ? debuggerScope->scopeProperties->Count() : 0u;
                size += PrependInt32(builder, _u("Debugger Scope Slot Array Property Count"), propertiesCount);
                size += AddSlotArrayDebuggerScopeProperties(builder, debuggerScope, propertiesCount);
                slotArrayCount++;
            }
        }
        Assert(debuggerScopeSlotArraySize == slotArrayCount);

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        size += PrependInt32(builder, _u("End SlotArrayDebuggerScopes"), magicEndOfDebuggerScopes);
#endif // BYTE_CODE_MAGIC_CONSTANTS

        return size;
    }